

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.cpp
# Opt level: O0

int __thiscall
FIX::FieldMap::calculateLength
          (FieldMap *this,int beginStringField,int bodyLengthField,int checkSumField)

{
  bool bVar1;
  int iVar2;
  pointer pFVar3;
  size_t sVar4;
  pointer ppVar5;
  reference ppFVar6;
  __normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
  local_70;
  FieldMap **local_68;
  __normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
  local_60;
  const_iterator k;
  _Rb_tree_const_iterator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>
  local_48;
  const_iterator j;
  const_iterator cStack_38;
  int tag;
  FieldBase *local_30;
  __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
  local_28;
  const_iterator i;
  int result;
  int checkSumField_local;
  int bodyLengthField_local;
  int beginStringField_local;
  FieldMap *this_local;
  
  i._M_current._0_4_ = 0;
  i._M_current._4_4_ = checkSumField;
  __gnu_cxx::
  __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
  ::__normal_iterator(&local_28);
  local_30 = (FieldBase *)
             std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::begin(&this->m_fields);
  local_28._M_current = local_30;
  while( true ) {
    cStack_38 = std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::end(&this->m_fields);
    bVar1 = __gnu_cxx::operator!=(&local_28,&stack0xffffffffffffffc8);
    if (!bVar1) break;
    pFVar3 = __gnu_cxx::
             __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
             ::operator->(&local_28);
    j._M_node._4_4_ = FieldBase::getTag(pFVar3);
    if (((j._M_node._4_4_ != beginStringField) && (j._M_node._4_4_ != bodyLengthField)) &&
       (j._M_node._4_4_ != i._M_current._4_4_)) {
      pFVar3 = __gnu_cxx::
               __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
               ::operator->(&local_28);
      sVar4 = FieldBase::getLength(pFVar3);
      i._M_current._0_4_ = (int)i._M_current + (int)sVar4;
    }
    __gnu_cxx::
    __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
    ::operator++(&local_28);
  }
  std::
  _Rb_tree_const_iterator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>
  ::_Rb_tree_const_iterator(&local_48);
  local_48._M_node =
       (_Base_ptr)
       std::
       map<int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
       ::begin(&this->m_groups);
  while( true ) {
    k._M_current = (FieldMap **)
                   std::
                   map<int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
                   ::end(&this->m_groups);
    bVar1 = std::operator!=(&local_48,(_Self *)&k);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
    ::__normal_iterator(&local_60);
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>
             ::operator->(&local_48);
    local_68 = (FieldMap **)
               std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>::begin
                         (&ppVar5->second);
    local_60._M_current = local_68;
    while( true ) {
      ppVar5 = std::
               _Rb_tree_const_iterator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>
               ::operator->(&local_48);
      local_70._M_current =
           (FieldMap **)
           std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>::end(&ppVar5->second);
      bVar1 = __gnu_cxx::operator!=(&local_60,&local_70);
      if (!bVar1) break;
      ppFVar6 = __gnu_cxx::
                __normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
                ::operator*(&local_60);
      iVar2 = calculateLength(*ppFVar6,8,9,10);
      i._M_current._0_4_ = iVar2 + (int)i._M_current;
      __gnu_cxx::
      __normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
      ::operator++(&local_60);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>
    ::operator++(&local_48);
  }
  return (int)i._M_current;
}

Assistant:

int FieldMap::calculateLength( int beginStringField,
                               int bodyLengthField,
                               int checkSumField ) const
{
  int result = 0;
  Fields::const_iterator i;
  for ( i = m_fields.begin(); i != m_fields.end(); ++i )
  {
    int tag = i->getTag();
    if ( tag != beginStringField
         && tag != bodyLengthField
         && tag != checkSumField )
    { result += i->getLength(); }
  }

  Groups::const_iterator j;
  for ( j = m_groups.begin(); j != m_groups.end(); ++j )
  {
    std::vector < FieldMap* > ::const_iterator k;
    for ( k = j->second.begin(); k != j->second.end(); ++k )
      result += ( *k ) ->calculateLength();
  }
  return result;
}